

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeRTASBuilderDestroyExt(ze_rtas_builder_ext_handle_t hBuilder)

{
  ze_pfnRTASBuilderDestroyExt_t pfnDestroyExt;
  ze_result_t result;
  ze_rtas_builder_ext_handle_t hBuilder_local;
  
  pfnDestroyExt._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c158 != (code *)0x0) {
    pfnDestroyExt._4_4_ = (*DAT_0011c158)(hBuilder);
  }
  return pfnDestroyExt._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASBuilderDestroyExt(
        ze_rtas_builder_ext_handle_t hBuilder           ///< [in][release] handle of builder object to destroy
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDestroyExt = context.zeDdiTable.RTASBuilder.pfnDestroyExt;
        if( nullptr != pfnDestroyExt )
        {
            result = pfnDestroyExt( hBuilder );
        }
        else
        {
            // generic implementation

        }

        return result;
    }